

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O1

void Abc_NtkUpdate(Abc_Obj_t *pObj,Abc_Obj_t *pObjNew,Vec_Vec_t *vLevels)

{
  *(uint *)&pObjNew->field_0x14 =
       *(uint *)&pObjNew->field_0x14 & 0xfff | *(uint *)&pObj->field_0x14 & 0xfffff000;
  Abc_ObjReplace(pObj,pObjNew);
  Abc_NtkUpdateLevel(pObjNew,vLevels);
  Abc_ObjSetReverseLevel(pObjNew,0);
  Abc_NtkUpdateReverseLevel(pObjNew,vLevels);
  return;
}

Assistant:

void Abc_NtkUpdate( Abc_Obj_t * pObj, Abc_Obj_t * pObjNew, Vec_Vec_t * vLevels )
{
    // replace the old node by the new node
    pObjNew->Level = pObj->Level;
    Abc_ObjReplace( pObj, pObjNew );
    // update the level of the node
    Abc_NtkUpdateLevel( pObjNew, vLevels );
    Abc_ObjSetReverseLevel( pObjNew, 0 );
    Abc_NtkUpdateReverseLevel( pObjNew, vLevels );
}